

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.hpp
# Opt level: O0

FilePath * __thiscall de::FilePath::join(FilePath *this,FilePath *b)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  FilePath *b_local;
  FilePath *this_local;
  
  local_18 = &b->m_path;
  b_local = this;
  bVar1 = std::operator==(&this->m_path,"");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)this,(string *)local_18);
  }
  else {
    std::operator+(&local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   separator_abi_cxx11_,local_18);
    std::__cxx11::string::operator+=((string *)this,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return this;
}

Assistant:

inline FilePath& FilePath::join (const FilePath& b)
{
	if (m_path == "")
		m_path = b.m_path;
	else
		m_path += separator + b.m_path;
	return *this;
}